

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetRepeatedEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int index,int value)

{
  bool bVar1;
  int number;
  ExtensionSet *this_00;
  int value_local;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    internal::ExtensionSet::SetRepeatedEnum(this_00,number,index,value);
  }
  else {
    SetRepeatedField<int>(this,message,field,index,value);
  }
  return;
}

Assistant:

void Reflection::SetRepeatedEnumValueInternal(Message* message,
                                              const FieldDescriptor* field,
                                              int index, int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedEnum(field->number(), index,
                                                  value);
  } else {
    SetRepeatedField<int>(message, field, index, value);
  }
}